

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int ffwritehisto(long totaln,long pixoffset,long firstn,long nvalues,int narrays,
                iteratorCol *imagepars,void *userPointer)

{
  int iVar1;
  void *pvVar2;
  iteratorCol *in_R9;
  undefined8 *in_stack_00000008;
  histType *histData;
  long offset;
  long rows_per_loop;
  int ncols;
  int status;
  int ii;
  iteratorCol *colpars;
  void *in_stack_00000270;
  _func_int_long_long_long_long_int_iteratorCol_ptr_void_ptr *in_stack_00000278;
  long in_stack_00000280;
  long in_stack_00000288;
  iteratorCol *in_stack_00000290;
  int in_stack_00000298;
  int *in_stack_000002b0;
  
  iVar1 = *(int *)((long)in_stack_00000008 + 0x24);
  if (iVar1 == 0xb) {
    pvVar2 = fits_iter_get_array(in_R9);
    *in_stack_00000008 = pvVar2;
  }
  else if (iVar1 == 0x15) {
    pvVar2 = fits_iter_get_array(in_R9);
    *in_stack_00000008 = pvVar2;
  }
  else if (iVar1 == 0x1f) {
    pvVar2 = fits_iter_get_array(in_R9);
    *in_stack_00000008 = pvVar2;
  }
  else if (iVar1 == 0x2a) {
    pvVar2 = fits_iter_get_array(in_R9);
    *in_stack_00000008 = pvVar2;
  }
  else if (iVar1 == 0x52) {
    pvVar2 = fits_iter_get_array(in_R9);
    *in_stack_00000008 = pvVar2;
  }
  ffiter(in_stack_00000298,in_stack_00000290,in_stack_00000288,in_stack_00000280,in_stack_00000278,
         in_stack_00000270,in_stack_000002b0);
  return 0;
}

Assistant:

int ffwritehisto(long totaln, long pixoffset, long firstn, long nvalues,
		 int narrays, iteratorCol *imagepars, void *userPointer)
/*
   Interator work function that writes out the histogram.
   The histogram values are calculated by another work function, ffcalchisto.
   This work function only gets called once, and totaln = nvalues.
*/
{
    iteratorCol *colpars;
    int ii, status = 0, ncols;
    long rows_per_loop = 0, offset = 0;
    histType *histData;

    histData = (histType *)userPointer;

    /* store pointer to the histogram array, and initialize to zero */

    switch( histData->himagetype ) {
    case TBYTE:
       histData->hist.b = (char *  ) fits_iter_get_array(imagepars);
       break;
    case TSHORT:
       histData->hist.i = (short * ) fits_iter_get_array(imagepars);
       break;
    case TINT:
       histData->hist.j = (int *   ) fits_iter_get_array(imagepars);
       break;
    case TFLOAT:
       histData->hist.r = (float * ) fits_iter_get_array(imagepars);
       break;
    case TDOUBLE:
       histData->hist.d = (double *) fits_iter_get_array(imagepars);
       break;
    }

    /* call iterator function to calc the histogram pixel values */

    /* must lock this call in multithreaded environoments because */
    /* the ffcalchist work routine uses static vaiables that would */
    /* get clobbered if multiple threads were running at the same time */
    fits_iterate_data(histData->numIterCols, histData->iterCols,
		      offset, rows_per_loop,
		      ffcalchist, (void*)histData, &status);

    return(status);
}